

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextDocument::setTextWidth(QTextDocument *this,qreal width)

{
  bool bVar1;
  QTextDocumentPrivate *size;
  QDebug *o;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDI;
  long in_FS_OFFSET;
  QMessageLogger *in_XMM0_Qa;
  QTextDocumentPrivate *d;
  QSizeF sz;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff78;
  QSizeF *this_00;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_01;
  QDebug local_40;
  QDebug in_stack_ffffffffffffffc8;
  QDebug local_30;
  QSizeF local_28;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  size = d_func((QTextDocument *)0x7ab656);
  local_28.wd = (size->pageSize).wd;
  local_28.ht = (size->pageSize).ht;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcLayout();
  anon_unknown.dwarf_1294c67::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_RDI,in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1294c67::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x7ab6d7);
    QMessageLogger::QMessageLogger
              (in_XMM0_Qa,(char *)size,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff78,(char *)0x7ab6ed);
    QMessageLogger::debug();
    o = QDebug::operator<<((QDebug *)this_01,(char *)in_stack_ffffffffffffffc8.stream);
    QDebug::QDebug((QDebug *)&stack0xffffffffffffffc8,o);
    ::operator<<((Stream *)&local_30,(QSizeF *)&stack0xffffffffffffffc8);
    QDebug::operator<<((QDebug *)this_01,(char *)in_stack_ffffffffffffffc8.stream);
    QDebug::operator<<((QDebug *)in_RDI,(double)in_stack_ffffffffffffff78);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
    QDebug::~QDebug(&local_40);
    local_10 = 0;
  }
  this_00 = &local_28;
  QSizeF::setWidth(this_00,(qreal)in_XMM0_Qa);
  QSizeF::setHeight(this_00,-1.0);
  setPageSize((QTextDocument *)in_XMM0_Qa,(QSizeF *)size);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::setTextWidth(qreal width)
{
    Q_D(QTextDocument);
    QSizeF sz = d->pageSize;

    qCDebug(lcLayout) << "page size" << sz << "-> width" << width;
    sz.setWidth(width);
    sz.setHeight(-1);
    setPageSize(sz);
}